

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O0

void idx2::DecodeTransformOrder(u64 Input,str Output)

{
  uint uVar1;
  char local_21;
  int local_1c;
  int T;
  int Len;
  str Output_local;
  u64 Input_local;
  
  local_1c = 0;
  for (Output_local = (str)Input; Output_local != (str)0x0;
      Output_local = (str)((ulong)Output_local >> 2)) {
    uVar1 = (uint)Output_local & 3;
    if (uVar1 == 3) {
      local_21 = '+';
    }
    else {
      local_21 = (char)uVar1 + 'X';
    }
    Output[local_1c] = local_21;
    local_1c = local_1c + 1;
  }
  Output[local_1c] = '\0';
  return;
}

Assistant:

void
DecodeTransformOrder(u64 Input, str Output)
{
  int Len = 0;
  while (Input != 0)
  {
    int T = Input & 0x3;
    Output[Len++] = T == 3 ? '+' : char('X' + T);
    Input >>= 2;
  }
  Output[Len] = '\0';
}